

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator
          (cmNinjaNormalTargetGenerator *this,cmGeneratorTarget *target)

{
  TargetType TVar1;
  string *psVar2;
  cmOSXBundleGenerator *this_00;
  string sStack_108;
  Names local_e8;
  
  cmNinjaTargetGenerator::cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator,target);
  (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_0053e378;
  cmGeneratorTarget::Names::Names(&this->TargetNames);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->TargetLinkLanguage,"",(allocator<char> *)&local_e8);
  (this->DeviceLinkObject)._M_dataplus._M_p = (pointer)&(this->DeviceLinkObject).field_2;
  (this->DeviceLinkObject)._M_string_length = 0;
  (this->DeviceLinkObject).field_2._M_local_buf[0] = '\0';
  psVar2 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmGeneratorTarget::GetLinkerLanguage(&local_e8.Base,target,psVar2);
  std::__cxx11::string::operator=((string *)&this->TargetLinkLanguage,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  TVar1 = cmGeneratorTarget::GetType(target);
  if (TVar1 == EXECUTABLE) {
    cmGeneratorTarget::GetExecutableNames
              (&local_e8,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
                ).ConfigName);
  }
  else {
    cmGeneratorTarget::GetLibraryNames
              (&local_e8,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
                ).ConfigName);
  }
  cmGeneratorTarget::Names::operator=(&this->TargetNames,&local_e8);
  cmGeneratorTarget::Names::~Names(&local_e8);
  TVar1 = cmGeneratorTarget::GetType(target);
  if (TVar1 != OBJECT_LIBRARY) {
    psVar2 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
    cmGeneratorTarget::GetDirectory(&local_e8.Base,target,psVar2,RuntimeBinaryArtifact);
    cmNinjaTargetGenerator::EnsureDirectoryExists
              (&this->super_cmNinjaTargetGenerator,&local_e8.Base);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  this_00 = (cmOSXBundleGenerator *)operator_new(0x40);
  psVar2 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  std::__cxx11::string::string((string *)&sStack_108,(string *)psVar2);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_00,target,&sStack_108);
  (this->super_cmNinjaTargetGenerator).OSXBundleGenerator = this_00;
  std::__cxx11::string::~string((string *)&sStack_108);
  ((this->super_cmNinjaTargetGenerator).OSXBundleGenerator)->MacContentFolders =
       &(this->super_cmNinjaTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator(
  cmGeneratorTarget* target)
  : cmNinjaTargetGenerator(target)
  , TargetLinkLanguage("")
{
  this->TargetLinkLanguage = target->GetLinkerLanguage(this->GetConfigName());
  if (target->GetType() == cmStateEnums::EXECUTABLE) {
    this->TargetNames = this->GetGeneratorTarget()->GetExecutableNames(
      GetLocalGenerator()->GetConfigName());
  } else {
    this->TargetNames = this->GetGeneratorTarget()->GetLibraryNames(
      GetLocalGenerator()->GetConfigName());
  }

  if (target->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    // on Windows the output dir is already needed at compile time
    // ensure the directory exists (OutDir test)
    EnsureDirectoryExists(target->GetDirectory(this->GetConfigName()));
  }

  this->OSXBundleGenerator =
    new cmOSXBundleGenerator(target, this->GetConfigName());
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}